

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btNNCGConstraintSolver.cpp
# Opt level: O3

btScalar __thiscall
btNNCGConstraintSolver::solveGroupCacheFriendlySetup
          (btNNCGConstraintSolver *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifoldPtr,int numManifolds,btTypedConstraint **constraints,
          int numConstraints,btContactSolverInfo *infoGlobal,btIDebugDraw *debugDrawer)

{
  int iVar1;
  float *pfVar2;
  uint uVar3;
  float *pfVar4;
  ulong uVar5;
  btScalar bVar6;
  
  bVar6 = btSequentialImpulseConstraintSolver::solveGroupCacheFriendlySetup
                    (&this->super_btSequentialImpulseConstraintSolver,bodies,numBodies,manifoldPtr,
                     numManifolds,constraints,numConstraints,infoGlobal,debugDrawer);
  iVar1 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverNonContactConstraintPool.
          m_size;
  uVar3 = (this->m_pNC).m_size;
  if (((int)uVar3 < iVar1) && ((this->m_pNC).m_capacity < iVar1)) {
    if (iVar1 == 0) {
      pfVar4 = (float *)0x0;
    }
    else {
      pfVar4 = (float *)btAlignedAllocInternal((long)iVar1 << 2,0x10);
      uVar3 = (this->m_pNC).m_size;
    }
    pfVar2 = (this->m_pNC).m_data;
    if ((int)uVar3 < 1) {
      if (pfVar2 != (float *)0x0) goto LAB_001a129c;
    }
    else {
      uVar5 = 0;
      do {
        pfVar4[uVar5] = pfVar2[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
LAB_001a129c:
      if ((this->m_pNC).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar2);
      }
    }
    (this->m_pNC).m_ownsMemory = true;
    (this->m_pNC).m_data = pfVar4;
    (this->m_pNC).m_capacity = iVar1;
  }
  (this->m_pNC).m_size = iVar1;
  iVar1 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverContactConstraintPool.m_size;
  uVar3 = (this->m_pC).m_size;
  if (((int)uVar3 < iVar1) && ((this->m_pC).m_capacity < iVar1)) {
    if (iVar1 == 0) {
      pfVar4 = (float *)0x0;
    }
    else {
      pfVar4 = (float *)btAlignedAllocInternal((long)iVar1 << 2,0x10);
      uVar3 = (this->m_pC).m_size;
    }
    pfVar2 = (this->m_pC).m_data;
    if ((int)uVar3 < 1) {
      if (pfVar2 != (float *)0x0) goto LAB_001a1325;
    }
    else {
      uVar5 = 0;
      do {
        pfVar4[uVar5] = pfVar2[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
LAB_001a1325:
      if ((this->m_pC).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar2);
      }
    }
    (this->m_pC).m_ownsMemory = true;
    (this->m_pC).m_data = pfVar4;
    (this->m_pC).m_capacity = iVar1;
  }
  (this->m_pC).m_size = iVar1;
  iVar1 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverContactFrictionConstraintPool
          .m_size;
  uVar3 = (this->m_pCF).m_size;
  if (((int)uVar3 < iVar1) && ((this->m_pCF).m_capacity < iVar1)) {
    if (iVar1 == 0) {
      pfVar4 = (float *)0x0;
    }
    else {
      pfVar4 = (float *)btAlignedAllocInternal((long)iVar1 << 2,0x10);
      uVar3 = (this->m_pCF).m_size;
    }
    pfVar2 = (this->m_pCF).m_data;
    if ((int)uVar3 < 1) {
      if (pfVar2 != (float *)0x0) goto LAB_001a13ae;
    }
    else {
      uVar5 = 0;
      do {
        pfVar4[uVar5] = pfVar2[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
LAB_001a13ae:
      if ((this->m_pCF).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar2);
      }
    }
    (this->m_pCF).m_ownsMemory = true;
    (this->m_pCF).m_data = pfVar4;
    (this->m_pCF).m_capacity = iVar1;
  }
  (this->m_pCF).m_size = iVar1;
  iVar1 = (this->super_btSequentialImpulseConstraintSolver).
          m_tmpSolverContactRollingFrictionConstraintPool.m_size;
  uVar3 = (this->m_pCRF).m_size;
  if (((int)uVar3 < iVar1) && ((this->m_pCRF).m_capacity < iVar1)) {
    if (iVar1 == 0) {
      pfVar4 = (float *)0x0;
    }
    else {
      pfVar4 = (float *)btAlignedAllocInternal((long)iVar1 << 2,0x10);
      uVar3 = (this->m_pCRF).m_size;
    }
    pfVar2 = (this->m_pCRF).m_data;
    if ((int)uVar3 < 1) {
      if (pfVar2 != (float *)0x0) goto LAB_001a143a;
    }
    else {
      uVar5 = 0;
      do {
        pfVar4[uVar5] = pfVar2[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
LAB_001a143a:
      if ((this->m_pCRF).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar2);
      }
    }
    (this->m_pCRF).m_ownsMemory = true;
    (this->m_pCRF).m_data = pfVar4;
    (this->m_pCRF).m_capacity = iVar1;
  }
  (this->m_pCRF).m_size = iVar1;
  iVar1 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverNonContactConstraintPool.
          m_size;
  uVar3 = (this->m_deltafNC).m_size;
  if (((int)uVar3 < iVar1) && ((this->m_deltafNC).m_capacity < iVar1)) {
    if (iVar1 == 0) {
      pfVar4 = (float *)0x0;
    }
    else {
      pfVar4 = (float *)btAlignedAllocInternal((long)iVar1 << 2,0x10);
      uVar3 = (this->m_deltafNC).m_size;
    }
    pfVar2 = (this->m_deltafNC).m_data;
    if ((int)uVar3 < 1) {
      if (pfVar2 != (float *)0x0) goto LAB_001a14c3;
    }
    else {
      uVar5 = 0;
      do {
        pfVar4[uVar5] = pfVar2[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
LAB_001a14c3:
      if ((this->m_deltafNC).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar2);
      }
    }
    (this->m_deltafNC).m_ownsMemory = true;
    (this->m_deltafNC).m_data = pfVar4;
    (this->m_deltafNC).m_capacity = iVar1;
  }
  (this->m_deltafNC).m_size = iVar1;
  iVar1 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverContactConstraintPool.m_size;
  uVar3 = (this->m_deltafC).m_size;
  if (((int)uVar3 < iVar1) && ((this->m_deltafC).m_capacity < iVar1)) {
    if (iVar1 == 0) {
      pfVar4 = (float *)0x0;
    }
    else {
      pfVar4 = (float *)btAlignedAllocInternal((long)iVar1 << 2,0x10);
      uVar3 = (this->m_deltafC).m_size;
    }
    pfVar2 = (this->m_deltafC).m_data;
    if ((int)uVar3 < 1) {
      if (pfVar2 != (float *)0x0) goto LAB_001a154c;
    }
    else {
      uVar5 = 0;
      do {
        pfVar4[uVar5] = pfVar2[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
LAB_001a154c:
      if ((this->m_deltafC).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar2);
      }
    }
    (this->m_deltafC).m_ownsMemory = true;
    (this->m_deltafC).m_data = pfVar4;
    (this->m_deltafC).m_capacity = iVar1;
  }
  (this->m_deltafC).m_size = iVar1;
  iVar1 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverContactFrictionConstraintPool
          .m_size;
  uVar3 = (this->m_deltafCF).m_size;
  if (((int)uVar3 < iVar1) && ((this->m_deltafCF).m_capacity < iVar1)) {
    if (iVar1 == 0) {
      pfVar4 = (float *)0x0;
    }
    else {
      pfVar4 = (float *)btAlignedAllocInternal((long)iVar1 << 2,0x10);
      uVar3 = (this->m_deltafCF).m_size;
    }
    pfVar2 = (this->m_deltafCF).m_data;
    if ((int)uVar3 < 1) {
      if (pfVar2 != (float *)0x0) goto LAB_001a15d5;
    }
    else {
      uVar5 = 0;
      do {
        pfVar4[uVar5] = pfVar2[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
LAB_001a15d5:
      if ((this->m_deltafCF).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar2);
      }
    }
    (this->m_deltafCF).m_ownsMemory = true;
    (this->m_deltafCF).m_data = pfVar4;
    (this->m_deltafCF).m_capacity = iVar1;
  }
  (this->m_deltafCF).m_size = iVar1;
  iVar1 = (this->super_btSequentialImpulseConstraintSolver).
          m_tmpSolverContactRollingFrictionConstraintPool.m_size;
  uVar3 = (this->m_deltafCRF).m_size;
  if ((iVar1 <= (int)uVar3) || (iVar1 <= (this->m_deltafCRF).m_capacity)) goto LAB_001a1683;
  if (iVar1 == 0) {
    pfVar4 = (float *)0x0;
  }
  else {
    pfVar4 = (float *)btAlignedAllocInternal((long)iVar1 << 2,0x10);
    uVar3 = (this->m_deltafCRF).m_size;
  }
  pfVar2 = (this->m_deltafCRF).m_data;
  if ((int)uVar3 < 1) {
    if (pfVar2 != (float *)0x0) goto LAB_001a1661;
  }
  else {
    uVar5 = 0;
    do {
      pfVar4[uVar5] = pfVar2[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
LAB_001a1661:
    if ((this->m_deltafCRF).m_ownsMemory == true) {
      btAlignedFreeInternal(pfVar2);
    }
  }
  (this->m_deltafCRF).m_ownsMemory = true;
  (this->m_deltafCRF).m_data = pfVar4;
  (this->m_deltafCRF).m_capacity = iVar1;
LAB_001a1683:
  (this->m_deltafCRF).m_size = iVar1;
  return bVar6;
}

Assistant:

btScalar btNNCGConstraintSolver::solveGroupCacheFriendlySetup(btCollisionObject** bodies,int numBodies,btPersistentManifold** manifoldPtr, int numManifolds,btTypedConstraint** constraints,int numConstraints,const btContactSolverInfo& infoGlobal,btIDebugDraw* debugDrawer)
{
	btScalar val = btSequentialImpulseConstraintSolver::solveGroupCacheFriendlySetup( bodies,numBodies,manifoldPtr, numManifolds, constraints,numConstraints,infoGlobal,debugDrawer);

	m_pNC.resizeNoInitialize(m_tmpSolverNonContactConstraintPool.size());
	m_pC.resizeNoInitialize(m_tmpSolverContactConstraintPool.size());
	m_pCF.resizeNoInitialize(m_tmpSolverContactFrictionConstraintPool.size());
	m_pCRF.resizeNoInitialize(m_tmpSolverContactRollingFrictionConstraintPool.size());

	m_deltafNC.resizeNoInitialize(m_tmpSolverNonContactConstraintPool.size());
	m_deltafC.resizeNoInitialize(m_tmpSolverContactConstraintPool.size());
	m_deltafCF.resizeNoInitialize(m_tmpSolverContactFrictionConstraintPool.size());
	m_deltafCRF.resizeNoInitialize(m_tmpSolverContactRollingFrictionConstraintPool.size());

	return val;
}